

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitNameInvoke(RegSlot lhsLocation,RegSlot objectLocation,RegSlot computedPropIdArrLocation,
                   uint32 *computedIndex,bool hasRest,ParseNodePtr nameNode,
                   ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  ParseNode *pnode;
  code *pcVar1;
  bool bVar2;
  uint cacheId;
  undefined4 *puVar3;
  ParseNodeUni *pPVar4;
  ParseNodeStr *pPVar5;
  
  if (nameNode == (ParseNodePtr)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1b3a,"(nameNode != nullptr)","nameNode != nullptr");
    if (!bVar2) goto LAB_0080e234;
    *puVar3 = 0;
  }
  if (nameNode->nop != knopStr) {
    if (nameNode->nop == knopComputedName) {
      pPVar4 = ParseNode::AsParseNodeUni(nameNode);
      pnode = pPVar4->pnode1;
      Emit(pnode,byteCodeGenerator,funcInfo,0,false,false);
      Js::ByteCodeWriter::Element
                (&byteCodeGenerator->m_writer,LdElemI_A,lhsLocation,objectLocation,pnode->location,
                 false,false);
      if (hasRest) {
        Js::ByteCodeWriter::Slot
                  (&byteCodeGenerator->m_writer,StPropIdArrFromVar,pnode->location,
                   computedPropIdArrLocation,*computedIndex);
        *computedIndex = *computedIndex + 1;
      }
      FuncInfo::ReleaseLoc(funcInfo,pnode);
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1b4a,"(nameNode->nop == knopStr)","nameNode->nop == knopStr");
    if (!bVar2) {
LAB_0080e234:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pPVar5 = ParseNode::AsParseNodeStr(nameNode);
  cacheId = FuncInfo::FindOrAddInlineCacheId
                      (funcInfo,objectLocation,pPVar5->pid->m_propertyId,false,false);
  Js::ByteCodeWriter::PatchableProperty
            (&byteCodeGenerator->m_writer,LdFld,lhsLocation,objectLocation,cacheId,false,true);
  return;
}

Assistant:

void EmitNameInvoke(Js::RegSlot lhsLocation,
    Js::RegSlot objectLocation,
    Js::RegSlot computedPropIdArrLocation,
    uint32 *computedIndex,
    bool hasRest,
    ParseNodePtr nameNode,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    Assert(nameNode != nullptr);
    if (nameNode->nop == knopComputedName)
    {
        ParseNodePtr pnode1 = nameNode->AsParseNodeUni()->pnode1;
        Emit(pnode1, byteCodeGenerator, funcInfo, false/*isConstructorCall*/);

        byteCodeGenerator->Writer()->Element(Js::OpCode::LdElemI_A, lhsLocation, objectLocation, pnode1->location);
        if (hasRest)
        {
            byteCodeGenerator->Writer()->Slot(Js::OpCode::StPropIdArrFromVar, pnode1->location, computedPropIdArrLocation, *computedIndex);
            (*computedIndex)++;
        }
        funcInfo->ReleaseLoc(pnode1);
    }
    else
    {
        Assert(nameNode->nop == knopStr);
        Js::PropertyId propertyId = nameNode->AsParseNodeStr()->pid->GetPropertyId();

        uint cacheId = funcInfo->FindOrAddInlineCacheId(objectLocation, propertyId, false/*isLoadMethod*/, false/*isStore*/);
        byteCodeGenerator->Writer()->PatchableProperty(Js::OpCode::LdFld, lhsLocation, objectLocation, cacheId);
    }
}